

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_output_module(MIR_context_t ctx,FILE *f,MIR_module_t_conflict module)

{
  MIR_item_t_conflict item;
  DLIST_MIR_item_t *pDVar1;
  
  if ((f != (FILE *)0x0) && (module != (MIR_module_t_conflict)0x0)) {
    fprintf((FILE *)f,"%s:\tmodule\n",module->name);
    pDVar1 = &module->items;
    while (item = pDVar1->head, item != (MIR_item_t_conflict)0x0) {
      MIR_output_item(ctx,f,item);
      pDVar1 = (DLIST_MIR_item_t *)&(item->item_link).next;
    }
    fwrite("\tendmodule\n",0xb,1,(FILE *)f);
    return;
  }
  __assert_fail("f != ((void*)0) && module != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xc4a,"void MIR_output_module(MIR_context_t, FILE *, MIR_module_t)");
}

Assistant:

void MIR_output_module (MIR_context_t ctx, FILE *f, MIR_module_t module) {
  mir_assert (f != NULL && module != NULL);
  fprintf (f, "%s:\tmodule\n", module->name);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, module->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item))
    MIR_output_item (ctx, f, item);
  fprintf (f, "\tendmodule\n");
}